

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O0

int green_poller_add(green_poller_t poller,green_future_t future)

{
  int lhs;
  size_t sVar1;
  green_future_t future_local;
  green_poller_t poller_local;
  
  fprintf(_stderr,"green_poller_add()\n");
  if ((poller == (green_poller_t)0x0) || (future == (green_future_t)0x0)) {
    poller_local._4_4_ = 1;
  }
  else if (future->loop == poller->loop) {
    if (future->poller == (green_poller_t)0x0) {
      if (poller->used == poller->size) {
        poller_local._4_4_ = 7;
      }
      else {
        if (poller->refs < 1) {
          fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","poller->refs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
                  ,0x1e1);
          fflush(_stderr);
          abort();
        }
        if (future->refs < 1) {
          fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future->refs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
                  ,0x1e2);
          fflush(_stderr);
          abort();
        }
        if (-1 < future->slot) {
          fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future->slot < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
                  ,0x1e3);
          fflush(_stderr);
          abort();
        }
        if (poller->size < poller->used) {
          fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","poller->used <= poller->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
                  ,0x1e5);
          fflush(_stderr);
          abort();
        }
        green_poller_dump(poller);
        green_future_acquire(future);
        poller->futures[poller->used] = future;
        sVar1 = poller->used;
        poller->used = sVar1 + 1;
        future->slot = (int)sVar1;
        future->poller = poller;
        if (future->state == green_future_pending) {
          lhs = future->slot;
          sVar1 = poller->busy;
          poller->busy = sVar1 + 1;
          green_poller_swap(poller,lhs,(int)sVar1);
        }
        poller_local._4_4_ = 0;
      }
    }
    else {
      poller_local._4_4_ = 5;
    }
  }
  else {
    poller_local._4_4_ = 1;
  }
  return poller_local._4_4_;
}

Assistant:

int green_poller_add(green_poller_t poller, green_future_t future)
{
    fprintf(stderr, "green_poller_add()\n");

    // Check for required arguments.
    if ((poller == NULL) || (future == NULL)) {
        return GREEN_EINVAL;
    }

    // Event loop must match.
    if (future->loop != poller->loop) {
        return GREEN_EINVAL;
    }

    // Future cannot be registered twice.
    if (future->poller != NULL) {
        return GREEN_EALREADY;
    }

    // Cannot exceed maximum poller size.
    if (poller->used == poller->size) {
        return GREEN_ENFILE;
    }

    green_assert(poller->refs > 0);
    green_assert(future->refs > 0);
    green_assert(future->slot < 0);
    green_assert(poller->used >= 0);
    green_assert(poller->used <= poller->size);

    green_poller_dump(poller);

    green_future_acquire(future);
    poller->futures[poller->used] = future;
    future->slot = poller->used++;
    future->poller = poller;
    if (future->state == green_future_pending) {
        green_poller_swap(poller, future->slot, poller->busy++);
    }

    return GREEN_SUCCESS;
}